

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

DoublePrecision pnga_rand(Integer iseed)

{
  double dVar1;
  unsigned_long lseed;
  double ret;
  unsigned_long in_stack_ffffffffffffec60;
  
  if (GA_Rand_seed == -1) {
    seedRand(in_stack_ffffffffffffec60);
    memcpy(&GA_Rand,&stack0xffffffffffffec60,5000);
    GA_Rand_seed = 0;
  }
  dVar1 = genRand((MTRand *)0x1e16d8);
  return dVar1;
}

Assistant:

double pnga_rand(Integer iseed)
{
  double ret;
  if (GA_Rand_seed == -1) {
    unsigned long lseed;
    /* Choose a value for iseed if it has not already been set */
    if (iseed == 0) {
      iseed = 121238;
    }
    lseed = (unsigned long)(abs(iseed));
    GA_Rand = seedRand(lseed);
    GA_Rand_seed = 0;
  }
  ret = genRand(&GA_Rand); 
  return ret;
}